

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attentional.h
# Opt level: O2

void __thiscall
dynet::AttentionalModel<dynet::LSTMBuilder>::add_fertility_params
          (AttentionalModel<dynet::LSTMBuilder> *this,Model *model,uint hidden_dim,
          bool _rnn_src_embeddings)

{
  undefined3 in_register_00000009;
  initializer_list<unsigned_int> x;
  initializer_list<unsigned_int> x_00;
  initializer_list<unsigned_int> x_01;
  initializer_list<unsigned_int> x_02;
  initializer_list<unsigned_int> x_03;
  initializer_list<unsigned_int> x_04;
  undefined1 auVar1 [16];
  uint local_5c;
  uint local_58;
  Dim local_54;
  
  local_58 = hidden_dim;
  if (CONCAT31(in_register_00000009,_rnn_src_embeddings) != 0) {
    local_58 = hidden_dim * 2;
  }
  x._M_len = 2;
  x._M_array = &local_5c;
  local_5c = hidden_dim;
  Dim::Dim(&local_54,x);
  auVar1 = dynet::Model::add_parameters((Dim *)model,0.0);
  this->p_Wfhid = (Parameter)auVar1[0];
  *(long *)&this->field_0xc9 = auVar1._1_8_;
  *(int7 *)&this->field_0xd1 = auVar1._9_7_;
  x_00._M_len = 1;
  x_00._M_array = &local_5c;
  local_5c = hidden_dim;
  Dim::Dim(&local_54,x_00);
  auVar1 = dynet::Model::add_parameters((Dim *)model,0.0);
  this->p_bfhid = (Parameter)auVar1[0];
  *(long *)&this->field_0xf9 = auVar1._1_8_;
  *(int7 *)&this->field_0x101 = auVar1._9_7_;
  x_01._M_len = 1;
  x_01._M_array = &local_5c;
  local_5c = hidden_dim;
  Dim::Dim(&local_54,x_01);
  auVar1 = dynet::Model::add_parameters((Dim *)model,0.0);
  this->p_Wfmu = (Parameter)auVar1[0];
  *(long *)&this->field_0xd9 = auVar1._1_8_;
  *(int7 *)&this->field_0xe1 = auVar1._9_7_;
  local_5c = 1;
  x_02._M_len = 1;
  x_02._M_array = &local_5c;
  Dim::Dim(&local_54,x_02);
  auVar1 = dynet::Model::add_parameters((Dim *)model,0.0);
  this->p_bfmu = (Parameter)auVar1[0];
  *(long *)&this->field_0x109 = auVar1._1_8_;
  *(int7 *)&this->field_0x111 = auVar1._9_7_;
  x_03._M_len = 1;
  x_03._M_array = &local_5c;
  local_5c = hidden_dim;
  Dim::Dim(&local_54,x_03);
  auVar1 = dynet::Model::add_parameters((Dim *)model,0.0);
  this->p_Wfvar = (Parameter)auVar1[0];
  *(long *)&this->field_0xe9 = auVar1._1_8_;
  *(int7 *)&this->field_0xf1 = auVar1._9_7_;
  local_5c = 1;
  x_04._M_len = 1;
  x_04._M_array = &local_5c;
  Dim::Dim(&local_54,x_04);
  auVar1 = dynet::Model::add_parameters((Dim *)model,0.0);
  this->p_bfvar = (Parameter)auVar1[0];
  *(long *)&this->field_0x119 = auVar1._1_8_;
  *(int7 *)&this->field_0x121 = auVar1._9_7_;
  this->global_fertility = true;
  return;
}

Assistant:

void AttentionalModel<Builder>::add_fertility_params(dynet::Model* model, unsigned hidden_dim, bool _rnn_src_embeddings)
{
    if (_rnn_src_embeddings) {
         p_Wfhid = model->add_parameters({hidden_dim, 2*hidden_dim});
     } else {
         p_Wfhid = model->add_parameters({hidden_dim, hidden_dim});
     }
     p_bfhid = model->add_parameters({hidden_dim});
     p_Wfmu = model->add_parameters({hidden_dim});
     p_bfmu = model->add_parameters({1});
     p_Wfvar = model->add_parameters({hidden_dim});
     p_bfvar = model->add_parameters({1});

     global_fertility = true;
}